

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O2

Time helics::fileops::loadTomlTime(value *timeElement,time_units defaultUnits)

{
  enable_if_t<detail::is_chrono_duration<duration<long,_ratio<1L,_1000000000L>_>_>::value,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  eVar1;
  Time TVar2;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar3;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  integer_type *piVar4;
  TimeRepresentation<count_time<9,_long>_> TVar5;
  floating_type *pfVar6;
  value *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  value *element;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  string_view unitString;
  string_view unitString_00;
  string_view timeString;
  string_view timeString_00;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value emptyVal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_value<toml::type_config> local_1b0;
  basic_value<toml::type_config> local_e8;
  
  switch(timeElement->type_) {
  case integer:
    piVar4 = toml::basic_value<toml::type_config>::as_integer(timeElement);
    TVar2.internalTimeCode = count_time<9,_long>::fromCount(*piVar4,defaultUnits);
    return (Time)TVar2.internalTimeCode;
  case floating:
    pfVar6 = toml::basic_value<toml::type_config>::as_floating(timeElement);
    TVar2.internalTimeCode =
         count_time<9,_long>::convert(*pfVar6 * timeCountReverse[(int)defaultUnits]);
    return (Time)TVar2.internalTimeCode;
  default:
    tomlAsString_abi_cxx11_((string *)&local_e8,(fileops *)timeElement,in_RDX);
    timeString._M_str = extraout_RDX_01;
    timeString._M_len = local_e8._0_8_;
    TVar5 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                      ((utilities *)local_e8.field_1.integer_.value,timeString);
    std::__cxx11::string::~string((string *)&local_e8);
    break;
  case local_time:
    eVar1 = toml::get<std::chrono::duration<long,std::ratio<1l,1000000000l>>,toml::type_config>
                      (timeElement);
    return (Time)eVar1.__r;
  case table:
    pbVar3 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                       (timeElement,(char (*) [5])0x3acaf1,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        emptyString_abi_cxx11_);
    if ((utilities *)pbVar3->_M_string_length != (utilities *)0x0) {
      unitString._M_str = extraout_RDX;
      unitString._M_len = (size_t)(pbVar3->_M_dataplus)._M_p;
      defaultUnits = gmlc::utilities::timeUnitsFromString
                               ((utilities *)pbVar3->_M_string_length,unitString);
    }
    pbVar3 = toml::find_or<std::__cxx11::string,toml::type_config,char[6]>
                       (timeElement,(char (*) [6])0x3ae6e5,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        emptyString_abi_cxx11_);
    if ((utilities *)pbVar3->_M_string_length != (utilities *)0x0) {
      unitString_00._M_str = extraout_RDX_00;
      unitString_00._M_len = (size_t)(pbVar3->_M_dataplus)._M_p;
      defaultUnits = gmlc::utilities::timeUnitsFromString
                               ((utilities *)pbVar3->_M_string_length,unitString_00);
    }
    toml::basic_value<toml::type_config>::basic_value(&local_e8);
    v = toml::find_or<toml::type_config,char[6]>(timeElement,(char (*) [6])0x3748f1,&local_e8);
    toml::basic_value<toml::type_config>::basic_value(&local_1b0,v);
    if (local_1b0.type_ == empty) {
      TVar5.internalTimeCode = -0x7fffffffffffffff;
    }
    else if (local_1b0.type_ == floating) {
      pfVar6 = toml::basic_value<toml::type_config>::as_floating(&local_1b0);
      TVar5.internalTimeCode =
           count_time<9,_long>::convert(*pfVar6 * timeCountReverse[(int)defaultUnits]);
    }
    else if (local_1b0.type_ == integer) {
      piVar4 = toml::basic_value<toml::type_config>::as_integer(&local_1b0);
      TVar5.internalTimeCode = count_time<9,_long>::fromCount(*piVar4,defaultUnits);
    }
    else {
      tomlAsString_abi_cxx11_(&local_1f0,(fileops *)&local_1b0,element);
      std::operator+(&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0
                     ," ");
      std::operator+(&local_210,&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar3);
      timeString_00._M_str = extraout_RDX_02;
      timeString_00._M_len = (size_t)local_210._M_dataplus._M_p;
      TVar5 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                        ((utilities *)local_210._M_string_length,timeString_00);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    toml::basic_value<toml::type_config>::~basic_value(&local_1b0);
    toml::basic_value<toml::type_config>::~basic_value(&local_e8);
  }
  return (Time)TVar5.internalTimeCode;
}

Assistant:

helics::Time loadTomlTime(const toml::value& timeElement, time_units defaultUnits)
{
    if (timeElement.is_table()) {
        const auto& unit = toml::find_or<std::string>(timeElement, "unit", emptyString);
        if (!unit.empty()) {
            defaultUnits = gmlc::utilities::timeUnitsFromString(unit);
        }
        const auto& units = toml::find_or<std::string>(timeElement, "units", emptyString);
        if (!units.empty()) {
            defaultUnits = gmlc::utilities::timeUnitsFromString(units);
        }
        const toml::value emptyVal;
        auto val = toml::find_or(timeElement, "value", emptyVal);
        if (!val.is_empty()) {
            if (val.is_integer()) {
                return {val.as_integer(), defaultUnits};
            }
            if (val.is_floating()) {
                return {val.as_floating() * toSecondMultiplier(defaultUnits)};
            }
            return gmlc::utilities::loadTimeFromString<helics::Time>(tomlAsString(val) + " " +
                                                                     units);
        }
    } else if (timeElement.is_integer()) {
        return {timeElement.as_integer(), defaultUnits};
    } else if (timeElement.is_floating()) {
        return {timeElement.as_floating() * toSecondMultiplier(defaultUnits)};
    } else if (timeElement.is_local_time()) {
        return {toml::get<std::chrono::nanoseconds>(timeElement)};
    } else {
        return gmlc::utilities::loadTimeFromString<helics::Time>(tomlAsString(timeElement));
    }
    return helics::Time::minVal();
}